

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_control_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::LFControlEndToEndTestThreaded_EndtoEndPSNRTest_Test::
~LFControlEndToEndTestThreaded_EndtoEndPSNRTest_Test
          (LFControlEndToEndTestThreaded_EndtoEndPSNRTest_Test *this)

{
  anon_unknown.dwarf_17bc3e0::LFControlEndToEndTest::~LFControlEndToEndTest
            ((LFControlEndToEndTest *)(this + -0x18));
  operator_delete((LFControlEndToEndTest *)(this + -0x18));
  return;
}

Assistant:

TEST(LFControlGetterTest, NullptrInput) {
  int *lf_level = nullptr;
  aom_codec_ctx_t encoder;
  aom_codec_enc_cfg_t cfg;
  aom_codec_enc_config_default(aom_codec_av1_cx(), &cfg, 1);
  EXPECT_EQ(aom_codec_enc_init(&encoder, aom_codec_av1_cx(), &cfg, 0),
            AOM_CODEC_OK);
  EXPECT_EQ(aom_codec_control(&encoder, AOME_GET_LOOPFILTER_LEVEL, lf_level),
            AOM_CODEC_INVALID_PARAM);
  EXPECT_EQ(aom_codec_destroy(&encoder), AOM_CODEC_OK);
}